

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureRunnerTests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_17994a::FakeTestFixture::FakeTestFixture
          (FakeTestFixture *this,TestFixtureResults runResults)

{
  MockArgumentHandler<ut11::Category> *pMVar1;
  MockArgumentHandler<> *pMVar2;
  _Rb_tree_header *p_Var3;
  MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  *pMVar4;
  
  (this->super_TestFixtureAbstract)._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__FakeTestFixture_0025f3f8;
  (this->m_runResults).ran = runResults.ran;
  (this->m_runResults).succeeded = runResults.succeeded;
  pMVar1 = &(this->mockAddCategory).m_argumentHandler;
  this->RunOutputUsed = (Output *)0x0;
  *(undefined8 *)&(this->mockAddCategory).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockAddCategory).m_callbackHandler.super__Function_base._M_functor + 8) = 0;
  (this->mockAddCategory).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockAddCategory).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<ut11::Category> **)
   ((long)&(this->mockAddCategory).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<ut11::Category>,_std::allocator<std::tuple<ut11::Category>_>_>
           ._M_impl._M_node.super__List_node_base + 8) = pMVar1;
  (this->mockAddCategory).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::Category>,_std::allocator<std::tuple<ut11::Category>_>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar1;
  pMVar2 = &(this->mockGetCategoriesConst).m_argumentHandler;
  (this->mockAddCategory).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<ut11::Category>,_std::allocator<std::tuple<ut11::Category>_>_>._M_impl
  ._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockAddCategory).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockAddCategory).m_returnHandler.m_returnCallback.super__Function_base._M_functor
   + 8) = 0;
  (this->mockAddCategory).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockAddCategory).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockGetCategoriesConst).m_callbackHandler.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->mockGetCategoriesConst).m_callbackHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->mockGetCategoriesConst).m_callbackHandler.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockGetCategoriesConst).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<> **)
   ((long)&(this->mockGetCategoriesConst).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node.
           super__List_node_base + 8) = pMVar2;
  (this->mockGetCategoriesConst).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pMVar2;
  (this->mockGetCategoriesConst).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node._M_size = 0;
  (this->mockGetCategoriesConst).m_returnHandler.m_isReturnCallbackMode = false;
  p_Var3 = &(this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl.
            super__Rb_tree_header;
  *(undefined8 *)&(this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl = 0;
  *(undefined8 *)
   &(this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl.super__Rb_tree_header.
    _M_header = 0;
  (this->mockGetCategoriesConst).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockGetCategoriesConst).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->mockGetCategoriesConst).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(undefined8 *)
   ((long)&(this->mockGetCategoriesConst).m_returnHandler.m_returnCallback.super__Function_base.
           _M_functor + 8) = 0;
  *(_Base_ptr *)
   ((long)&(this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var3;
  *(_Rb_tree_header **)
   ((long)&(this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var3;
  pMVar4 = &(this->mockGiven).m_argumentHandler;
  (this->mockGetCategoriesConst).m_returnHandler.m_returnValue._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  *(undefined8 *)&(this->mockGiven).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mockGiven).m_callbackHandler.super__Function_base._M_functor + 8) =
       0;
  (this->mockGiven).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockGiven).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockGiven).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar4;
  (this->mockGiven).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar4;
  pMVar4 = &(this->mockWhen).m_argumentHandler;
  (this->mockWhen).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->mockWhen).m_callbackHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->mockWhen).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockGiven).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockWhen).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockGiven).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockGiven).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockGiven).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->mockGiven).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockWhen).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar4;
  (this->mockWhen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar4;
  pMVar4 = &(this->mockThen).m_argumentHandler;
  (this->mockThen).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->mockThen).m_callbackHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->mockThen).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockWhen).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockThen).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockWhen).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockWhen).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockWhen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->mockWhen).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockThen).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar4;
  (this->mockThen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar4;
  pMVar4 = &(this->mockFinally).m_argumentHandler;
  (this->mockFinally).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->mockFinally).m_callbackHandler.super__Function_base._M_functor + 8)
       = 0;
  (this->mockFinally).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockThen).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockFinally).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockThen).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8) =
       0;
  (this->mockThen).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockThen).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->mockThen).m_returnHandler.m_returnCallback.super__Function_base._M_functor
       = 0;
  *(MockArgumentHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    **)((long)&(this->mockFinally).m_argumentHandler.m_arguments.
               super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl._M_node.super__List_node_base + 8) = pMVar4;
  (this->mockFinally).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pMVar4;
  pMVar2 = &(this->mockGetNameConst).m_argumentHandler;
  (this->mockGetNameConst).m_callbackHandler._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   ((long)&(this->mockGetNameConst).m_callbackHandler.super__Function_base._M_functor + 8) = 0;
  (this->mockGetNameConst).m_callbackHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mockFinally).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->mockGetNameConst).m_callbackHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockFinally).m_returnHandler.m_returnCallback.super__Function_base._M_functor + 8)
       = 0;
  (this->mockFinally).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockFinally).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   &(this->mockFinally).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(MockArgumentHandler<> **)
   ((long)&(this->mockGetNameConst).m_argumentHandler.m_arguments.
           super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node.
           super__List_node_base + 8) = pMVar2;
  (this->mockGetNameConst).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)pMVar2;
  (this->mockGetNameConst).m_argumentHandler.m_arguments.
  super__List_base<std::tuple<>,_std::allocator<std::tuple<>_>_>._M_impl._M_node._M_size = 0;
  (this->mockGetNameConst).m_returnHandler.m_isReturnCallbackMode = false;
  (this->mockGetNameConst).m_returnHandler.m_returnCallback.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->mockGetNameConst).m_returnHandler.m_returnCallback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->mockGetNameConst).m_returnHandler.m_returnCallback.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mockGetNameConst).m_returnHandler.m_returnCallback.super__Function_base._M_functor
   + 8) = 0;
  (this->mockGetNameConst).m_returnHandler.m_returnValue._M_dataplus._M_p =
       (pointer)&(this->mockGetNameConst).m_returnHandler.m_returnValue.field_2;
  (this->mockGetNameConst).m_returnHandler.m_returnValue._M_string_length = 0;
  (this->mockGetNameConst).m_returnHandler.m_returnValue.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

FakeTestFixture(ut11::detail::TestFixtureResults runResults)
			: m_runResults(runResults), RunOutputUsed(nullptr)
		{
		}